

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.cpp
# Opt level: O0

int __thiscall
TPZFBMatrix<std::complex<float>_>::SetBand(TPZFBMatrix<std::complex<float>_> *this,int64_t newBand)

{
  long lVar1;
  TPZVec<std::complex<float>_> *in_RSI;
  long *in_RDI;
  uint64_t newSize;
  char *in_stack_000001d8;
  char *in_stack_000001e0;
  TPZVec<std::complex<float>_> *this_00;
  
  this_00 = in_RSI;
  lVar1 = (**(code **)(*in_RDI + 0x60))();
  if (lVar1 <= (long)this_00) {
    TPZMatrix<std::complex<float>_>::Error(in_stack_000001e0,in_stack_000001d8);
  }
  (**(code **)(*in_RDI + 0x60))();
  in_RDI[8] = (long)in_RSI;
  in_RDI[9] = (long)in_RSI;
  TPZVec<std::complex<float>_>::resize(this_00,(int64_t)in_RDI);
  (**(code **)(*in_RDI + 0x78))();
  return 1;
}

Assistant:

int
TPZFBMatrix<TVar>::SetBand( int64_t newBand )
{
	if ( newBand >= Dim() )
		this->Error(__PRETTY_FUNCTION__, "SetBand <the band must be lower than the matrix dimension " );
	
	uint64_t newSize = Dim()*(3 * newBand + 1);
    fBandLower = newBand;
    fBandUpper = newBand;
    fElem.resize(newSize);
    Zero();
	return( 1 );
}